

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool OrderEdgesAroundOpenVertex(ON_Brep *B,int vid,ON_2dex *trim_ends)

{
  int iVar1;
  int iVar2;
  ON_BrepVertex *pOVar3;
  int *piVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  ON_BrepEdge *pOVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ON_BrepTrim *pOVar12;
  bool bVar13;
  
  if (vid < 0) {
    return false;
  }
  pOVar3 = (B->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
  if ((-1 < pOVar3[(uint)vid].m_vertex_index) &&
     (lVar10 = (long)pOVar3[(uint)vid].m_ei.m_count, 1 < lVar10)) {
    piVar4 = pOVar3[(uint)vid].m_ei.m_a;
    pOVar8 = (B->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    uVar7 = 0xffffffff;
    lVar9 = 0;
    uVar11 = 0xffffffff;
    do {
      iVar1 = piVar4[lVar9];
      if (pOVar8[iVar1].m_edge_index < 0) {
        return false;
      }
      uVar6 = uVar7;
      if (((pOVar8[iVar1].m_ti.m_count == 1) && (uVar6 = (uint)lVar9, -1 < (int)uVar7)) &&
         (bVar13 = -1 < (int)uVar11, uVar6 = uVar7, uVar11 = (uint)lVar9, bVar13)) {
        return false;
      }
      uVar7 = uVar6;
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
    if (-1 < (int)(uVar7 | uVar11)) {
      iVar1 = piVar4[uVar7];
      iVar2 = pOVar8[iVar1].m_vi[0];
      iVar1 = *pOVar8[iVar1].m_ti.m_a;
      lVar9 = (long)iVar1;
      pOVar12 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
      trim_ends->i = iVar1;
      bVar13 = pOVar12[lVar9].m_bRev3d == (iVar2 == vid);
      uVar7 = (uint)bVar13;
      trim_ends->j = (uint)bVar13;
      lVar10 = 0;
      while( true ) {
        if (uVar7 == 0) {
          uVar7 = ON_Brep::PrevNonsingularTrim(B,(int)lVar9);
        }
        else {
          uVar7 = ON_Brep::NextNonsingularTrim(B,(int)lVar9);
        }
        if ((int)uVar7 < 0) {
          return false;
        }
        pOVar12 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a +
                  uVar7;
        pOVar8 = ON_BrepTrim::Edge(pOVar12);
        if (pOVar8 == (ON_BrepEdge *)0x0) {
          return false;
        }
        iVar1 = (pOVar8->m_ti).m_count;
        if (2 < iVar1) {
          return false;
        }
        if (iVar1 == 1) break;
        puVar5 = (uint *)(pOVar8->m_ti).m_a;
        uVar7 = puVar5[*puVar5 == uVar7];
        lVar9 = (long)(int)uVar7;
        trim_ends[lVar10 + 1].i = uVar7;
        uVar7 = 1 - trim_ends[lVar10].j;
        if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a[lVar9].
            m_bRev3d != pOVar12->m_bRev3d) {
          uVar7 = trim_ends[lVar10].j;
        }
        trim_ends[lVar10 + 1].j = uVar7;
        lVar10 = lVar10 + 1;
        if (pOVar3[(uint)vid].m_ei.m_count <= lVar10) {
          return false;
        }
      }
      if ((pOVar12->m_ei == pOVar3[(uint)vid].m_ei.m_a[uVar11]) &&
         ((int)lVar10 - pOVar3[(uint)vid].m_ei.m_count == -2)) {
        trim_ends[lVar10 + 1].i = uVar7;
        trim_ends[lVar10 + 1].j = 1 - trim_ends[lVar10].j;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool OrderEdgesAroundOpenVertex(const ON_Brep& B, int vid, ON_2dex* trim_ends)

{
  if (vid<0)
    return false;
  const ON_BrepVertex& V = B.m_V[vid];
  if (V.m_vertex_index < 0)
    return false;
  if (V.m_ei.Count() < 2)
    return false;
  int i;
  int start = -1;
  int end = -1;
  for (i=0; i<V.m_ei.Count(); i++){
    const ON_BrepEdge& E = B.m_E[V.m_ei[i]];
    if (E.m_edge_index < 0)
      return false;
    if (E.m_ti.Count() == 1){
      if (start < 0)
        start = i;
      else if (end < 0)
        end = i;
      else
        return false;
    }
  }
  if (start < 0 || end < 0)
    return false;
  const ON_BrepEdge& StartE = B.m_E[V.m_ei[start]];
  bool bAtStart = (StartE.m_vi[0] == vid) ? true : false;
  const ON_BrepTrim& StartT = B.m_T[StartE.m_ti[0]];
  ON_2dex& start_te = trim_ends[0];
  start_te.i = StartE.m_ti[0];
  start_te.j = (bAtStart == StartT.m_bRev3d) ? 1 : 0;
  int count = 0;
  while (count < V.m_ei.Count()){
    const ON_2dex& lte = trim_ends[count];
    count++;
    int next_ti =  (lte.j) ? B.NextNonsingularTrim(lte.i) : B.PrevNonsingularTrim(lte.i);
   if (next_ti<0)
     return false;
   const ON_BrepTrim& NT = B.m_T[next_ti];
   const ON_BrepEdge* pNE = NT.Edge();
   if (!pNE)
     return false;
   if (pNE->m_ti.Count() > 2)
     return false;
   if (pNE->m_ti.Count() == 1){
     if (NT.m_ei == V.m_ei[end]){
       if (count != V.m_ei.Count()-1)
         return false;
       ON_2dex& end_te = trim_ends[count];
       end_te.i = next_ti;
       end_te.j = 1-lte.j;
       return true;
     }
     return false;
   }
   ON_2dex& nte = trim_ends[count];
   nte.i = (pNE->m_ti[0] == next_ti) ? pNE->m_ti[1] : pNE->m_ti[0];
   const ON_BrepTrim& NTi = B.m_T[nte.i];
   nte.j = (NTi.m_bRev3d == NT.m_bRev3d) ? 1-lte.j : lte.j;
  }
  return false;
}